

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void alListenerfv(ALenum param,ALfloat *values)

{
  uint32 uVar1;
  uint32 x;
  ulong uVar2;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alListenerfv);
  writele32(param);
  IO_UINT64((uint64)values);
  if (param == 0x100f) {
    uVar1 = 6;
  }
  else if ((param == 0x1006) || (uVar1 = 1, param == 0x1004)) {
    uVar1 = 3;
  }
  x = 0;
  if (values != (ALfloat *)0x0) {
    x = uVar1;
  }
  writele32(x);
  if (values != (ALfloat *)0x0) {
    uVar2 = 0;
    do {
      writele32((uint32)values[uVar2]);
      uVar2 = uVar2 + 1;
    } while (x + (x == 0) != uVar2);
  }
  (*REAL_alListenerfv)(param,values);
  check_listener_state();
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alListenerfv(ALenum param, const ALfloat *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alListenerfv);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_GAIN: break;
        case AL_POSITION: numvals = 3; break;
        case AL_VELOCITY: numvals = 3; break;
        case AL_ORIENTATION: numvals = 6; break;
        default: break;   /* uhoh. */
    }

    if (!values) { numvals = 0; }

    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_FLOAT(values[i]);
    }

    REAL_alListenerfv(param, values);

    check_listener_state();

    IO_END();
}